

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_free_elem(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_elem *plVar1;
  lyxml_elem *next;
  lyxml_elem *e;
  lyxml_elem *elem_local;
  ly_ctx *ctx_local;
  
  if (elem != (lyxml_elem *)0x0) {
    lyxml_free_attrs(ctx,elem);
    next = elem->child;
    while (next != (lyxml_elem *)0x0) {
      plVar1 = next->next;
      lyxml_free_elem(ctx,next);
      next = plVar1;
    }
    lydict_remove(ctx,elem->name);
    lydict_remove(ctx,elem->content);
    free(elem);
  }
  return;
}

Assistant:

static void
lyxml_free_elem(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_elem *e, *next;

    if (!elem) {
        return;
    }

    lyxml_free_attrs(ctx, elem);
    LY_TREE_FOR_SAFE(elem->child, next, e) {
        lyxml_free_elem(ctx, e);
    }
    lydict_remove(ctx, elem->name);
    lydict_remove(ctx, elem->content);
    free(elem);
}